

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands1.cxx
# Opt level: O2

void GetBootstrapCommands1(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  cmFindPackageCommand *pcVar1;
  cmFindPackageCommand *local_38;
  
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0bc0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0c50;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0ce0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0d70;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0e00;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0e90;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0f20;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c0fb0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1040;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c10d0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x68);
  cmCMakeMinimumRequired::cmCMakeMinimumRequired((cmCMakeMinimumRequired *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1200;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0xa0);
  cmConfigureFileCommand::cmConfigureFileCommand((cmConfigureFileCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1380;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1410;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0xb0);
  cmDefinePropertyCommand::cmDefinePropertyCommand((cmDefinePropertyCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1530;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c15c0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1650;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c16e0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1770;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1800;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1890;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1920;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c19b0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1a40;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1b00;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindFileCommand::cmFindFileCommand((cmFindFileCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x370);
  cmFindPackageCommand::cmFindPackageCommand(pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindProgramCommand::cmFindProgramCommand((cmFindProgramCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1d68;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c1e58;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  return;
}

Assistant:

void GetBootstrapCommands1(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmAddCustomCommandCommand);
  commands.push_back(new cmAddCustomTargetCommand);
  commands.push_back(new cmAddDefinitionsCommand);
  commands.push_back(new cmAddDependenciesCommand);
  commands.push_back(new cmAddExecutableCommand);
  commands.push_back(new cmAddLibraryCommand);
  commands.push_back(new cmAddSubDirectoryCommand);
  commands.push_back(new cmAddTestCommand);
  commands.push_back(new cmBreakCommand);
  commands.push_back(new cmBuildCommand);
  commands.push_back(new cmCMakeMinimumRequired);
  commands.push_back(new cmCMakePolicyCommand);
  commands.push_back(new cmConfigureFileCommand);
  commands.push_back(new cmContinueCommand);
  commands.push_back(new cmCreateTestSourceList);
  commands.push_back(new cmDefinePropertyCommand);
  commands.push_back(new cmElseCommand);
  commands.push_back(new cmEnableLanguageCommand);
  commands.push_back(new cmEnableTestingCommand);
  commands.push_back(new cmEndForEachCommand);
  commands.push_back(new cmEndFunctionCommand);
  commands.push_back(new cmEndIfCommand);
  commands.push_back(new cmEndMacroCommand);
  commands.push_back(new cmEndWhileCommand);
  commands.push_back(new cmExecProgramCommand);
  commands.push_back(new cmExecuteProcessCommand);
  commands.push_back(new cmFileCommand);
  commands.push_back(new cmFindFileCommand);
  commands.push_back(new cmFindLibraryCommand);
  commands.push_back(new cmFindPackageCommand);
  commands.push_back(new cmFindPathCommand);
  commands.push_back(new cmFindProgramCommand);
  commands.push_back(new cmForEachCommand);
  commands.push_back(new cmFunctionCommand);
}